

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::EditHistoryNext(Linenoise *this,HistoryScrollDirection dir)

{
  ulong uVar1;
  char *__dest;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  char *__src;
  size_t sVar5;
  size_t sVar6;
  
  iVar3 = History::GetLength();
  if (iVar3 < 2) {
    return;
  }
  uVar1 = iVar3 - 1;
  History::Overwrite(uVar1 - this->history_index,this->buf);
  switch(dir) {
  case LINENOISE_HISTORY_NEXT:
    if (this->history_index == 0) {
      return;
    }
    uVar4 = this->history_index - 1;
    this->history_index = uVar4;
    break;
  case LINENOISE_HISTORY_PREV:
    uVar4 = this->history_index + 1;
    this->history_index = uVar4;
    if (iVar3 <= uVar4) {
      this->history_index = uVar1;
      return;
    }
    break;
  case LINENOISE_HISTORY_START:
    this->history_index = uVar1;
    uVar4 = uVar1;
    break;
  case LINENOISE_HISTORY_END:
    this->history_index = 0;
    uVar4 = 0;
    break;
  default:
    uVar4 = this->history_index;
  }
  __dest = this->buf;
  __src = History::GetEntry(uVar1 - uVar4);
  strncpy(__dest,__src,this->buflen);
  this->buf[this->buflen - 1] = '\0';
  sVar5 = strlen(this->buf);
  this->pos = sVar5;
  this->len = sVar5;
  bVar2 = Terminal::IsMultiline();
  if (dir == LINENOISE_HISTORY_NEXT && bVar2) {
    sVar6 = ColAndRowToPosition(this,1,(int)this->len);
    this->pos = sVar6;
  }
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditHistoryNext(HistoryScrollDirection dir) {
	auto history_len = History::GetLength();
	if (history_len > 1) {
		/* Update the current history entry before to
		 * overwrite it with the next one. */
		History::Overwrite(history_len - 1 - history_index, buf);
		/* Show the new entry */
		switch (dir) {
		case HistoryScrollDirection::LINENOISE_HISTORY_PREV:
			// scroll back
			history_index++;
			if (history_index >= history_len) {
				history_index = history_len - 1;
				return;
			}
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_NEXT:
			// scroll forwards
			if (history_index == 0) {
				return;
			}
			history_index--;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_END:
			history_index = 0;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_START:
			history_index = history_len - 1;
			break;
		}
		strncpy(buf, History::GetEntry(history_len - 1 - history_index), buflen);
		buf[buflen - 1] = '\0';
		len = pos = strlen(buf);
		if (Terminal::IsMultiline() && dir == HistoryScrollDirection::LINENOISE_HISTORY_NEXT) {
			pos = ColAndRowToPosition(1, len);
		}
		RefreshLine();
	}
}